

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O0

bool exercise_octal::test_uintwide_t_spot_values_exercise_octal(void)

{
  byte bVar1;
  bool bVar2;
  void *this;
  basic_ostream<char,_std::char_traits<char>_> *out;
  byte local_1fa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  stringstream local_1b8 [8];
  stringstream strm;
  undefined1 local_1a8 [383];
  byte local_29;
  undefined1 auStack_28 [7];
  bool result_conversion_is_ok;
  local_uint128_t u_oct;
  local_uint128_t u_dec;
  
  u_oct.values.super_array<unsigned_int,_4UL>.elems[2] = 0x35056427;
  u_oct.values.super_array<unsigned_int,_4UL>.elems[3] = 0x2b8a5349;
  auStack_28._0_4_ = 0x35056427;
  stack0xffffffffffffffdc = 0x2b8a5349;
  u_oct.values.super_array<unsigned_int,_4UL>.elems[0] = 0x72c74d82;
  u_oct.values.super_array<unsigned_int,_4UL>.elems[1] = 0x134261;
  local_29 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator==
                       ((uintwide_t<128U,_unsigned_int,_void,_false> *)
                        (u_oct.values.super_array<unsigned_int,_4UL>.elems + 2),
                        (uintwide_t<128U,_unsigned_int,_void,_false> *)auStack_28);
  std::__cxx11::stringstream::stringstream(local_1b8);
  this = (void *)std::ostream::operator<<(local_1a8,std::showbase);
  out = (basic_ostream<char,_std::char_traits<char>_> *)std::ostream::operator<<(this,std::oct);
  math::wide_integer::operator<<(out,(uintwide_t<128U,_unsigned_int,_void,_false> *)auStack_28);
  std::__cxx11::stringstream::str();
  bVar2 = std::operator==(&local_1e8,"0464114134543515404256122464446501262047");
  local_1fa = 0;
  if (bVar2) {
    local_1fa = local_29;
  }
  local_29 = local_1fa & 1;
  std::__cxx11::string::~string((string *)&local_1e8);
  bVar1 = local_29;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return (bool)(bVar1 & 1);
}

Assistant:

auto test_uintwide_t_spot_values_exercise_octal() -> bool
  {
    #if defined(WIDE_INTEGER_NAMESPACE)
    using local_uint128_t = WIDE_INTEGER_NAMESPACE::math::wide_integer::uint128_t;
    #else
    using local_uint128_t = ::math::wide_integer::uint128_t;
    #endif

    constexpr local_uint128_t u_dec("100000000000000000000777772222211111");
    constexpr local_uint128_t u_oct("0464114134543515404256122464446501262047");

    auto result_conversion_is_ok = (u_dec == u_oct);

    static_assert(u_dec == u_oct, "Error: Conversion decimal to octal is not OK");

    std::stringstream strm;

    strm << std::showbase << std::oct << u_oct;

    result_conversion_is_ok = ((strm.str() == "0464114134543515404256122464446501262047") && result_conversion_is_ok);

    return result_conversion_is_ok;
  }